

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O2

u64 u64Rev(u64 w)

{
  return w >> 0x38 | (w & 0xff000000000000) >> 0x28 | (w & 0xff0000000000) >> 0x18 |
         (w & 0xff00000000) >> 8 | (w & 0xff000000) << 8 | (w & 0xff0000) << 0x18 |
         (w & 0xff00) << 0x28 | w << 0x38;
}

Assistant:

u64 u64Rev(u64 w)
{
	return w << 56 | (w & 0xFF00) << 40 | (w & 0xFF0000) << 24 |
		(w & 0xFF000000) << 8 | (w >> 8 & 0xFF000000) |
		(w >> 24 & 0xFF0000) | (w >> 40 & 0xFF00) | w >> 56;
}